

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

WasmImport * __thiscall Js::WebAssemblyModule::GetImport(WebAssemblyModule *this,uint32 i)

{
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type *ppWVar1;
  WasmCompilationException *this_01;
  
  this_00 = (this->m_imports).ptr;
  if (i < (uint)(this_00->
                super_ReadOnlyList<Wasm::WasmImport_*,_Memory::ArenaAllocator,_DefaultComparer>).
                count) {
    ppWVar1 = JsUtil::
              List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,i);
    return *ppWVar1;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  Wasm::WasmCompilationException::WasmCompilationException(this_01,L"Import index out of range");
  __cxa_throw(this_01,&Wasm::WasmCompilationException::typeinfo,
              Wasm::WasmCompilationException::~WasmCompilationException);
}

Assistant:

Wasm::WasmImport*
WebAssemblyModule::GetImport(uint32 i) const
{
    if (i >= GetImportCount())
    {
        throw Wasm::WasmCompilationException(_u("Import index out of range"));
    }
    return m_imports->Item(i);
}